

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::StringValue::_InternalSerialize
          (StringValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  WireFormatLite *this_00;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string *local_38;
  string *_s;
  StringValue *pSStack_28;
  uint32_t cached_has_bits;
  StringValue *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  StringValue *this_local;
  
  _s._4_4_ = 0;
  pSStack_28 = this;
  this_ = (StringValue *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  _internal_value_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_38 = _internal_value_abi_cxx11_(pSStack_28);
    this_00 = (WireFormatLite *)std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.StringValue.value");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_48._M_str;
    internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(ulong)uVar2,1,(Operation)local_48._M_len,field_name);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)this_,1,local_38,(uint8_t *)stream_local);
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pSStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pSStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* StringValue::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const StringValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.StringValue)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // string value = 1;
          if (!this_._internal_value().empty()) {
            const std::string& _s = this_._internal_value();
            ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
                _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.StringValue.value");
            target = stream->WriteStringMaybeAliased(1, _s, target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.StringValue)
          return target;
        }